

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<double>::AddKel
          (TPZMatrix<double> *this,TPZFMatrix<double> *elmat,TPZVec<long> *source,
          TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  long lVar3;
  TPZFMatrix<double> *pTVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double prevval;
  double local_70;
  TPZFMatrix<double> *local_68;
  TPZVec<long> *local_60;
  TPZVec<long> *local_58;
  long local_50;
  long local_48;
  long local_40;
  TPZMatrix<double> *local_38;
  
  lVar6 = source->fNElements;
  local_68 = elmat;
  local_60 = source;
  local_58 = destinationindex;
  iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_40 = lVar6;
  local_38 = this;
  if (iVar5 == 0) {
    if (0 < lVar6) {
      local_50 = 0;
      do {
        pTVar4 = local_68;
        lVar6 = local_58->fStore[local_50];
        lVar8 = local_60->fStore[local_50];
        lVar7 = 0;
        local_48 = lVar6;
        do {
          lVar1 = local_58->fStore[lVar7];
          lVar2 = local_60->fStore[lVar7];
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar6,lVar1);
          this = local_38;
          lVar6 = local_48;
          lVar3 = (pTVar4->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if (((lVar3 <= lVar8 || lVar8 < 0) || (lVar2 < 0)) ||
             ((pTVar4->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_70 = extraout_XMM0_Qa_00 + pTVar4->fElem[lVar3 * lVar2 + lVar8];
          (*(local_38->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (local_38,local_48,lVar1,&local_70);
          lVar7 = lVar7 + 1;
        } while (local_40 != lVar7);
        local_50 = local_50 + 1;
      } while (local_50 != local_40);
    }
  }
  else if (0 < lVar6) {
    lVar6 = 0;
    do {
      pTVar4 = local_68;
      lVar8 = local_58->fStore[lVar6];
      lVar7 = local_60->fStore[lVar6];
      local_50 = lVar6;
      local_48 = lVar8;
      do {
        lVar1 = local_58->fStore[lVar6];
        lVar2 = local_60->fStore[lVar6];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar8,lVar1);
        this = local_38;
        lVar8 = local_48;
        lVar3 = (pTVar4->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if (((lVar3 <= lVar7 || lVar7 < 0) || (lVar2 < 0)) ||
           ((pTVar4->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_70 = extraout_XMM0_Qa + pTVar4->fElem[lVar3 * lVar2 + lVar7];
        (*(local_38->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (local_38,local_48,lVar1,&local_70);
        lVar6 = lVar6 + 1;
      } while (lVar6 < local_40);
      lVar6 = local_50 + 1;
    } while (lVar6 != local_40);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}